

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void erase_ref(h2o_cache_t *cache,khiter_t iter,int reuse)

{
  uint uVar1;
  kh_cache_t *pkVar2;
  h2o_cache_ref_t *ref;
  st_h2o_linklist_t *psVar3;
  st_h2o_linklist_t *psVar4;
  uint uVar5;
  
  pkVar2 = cache->table;
  ref = pkVar2->keys[iter];
  if ((reuse == 0) && (pkVar2->n_buckets != iter)) {
    uVar1 = pkVar2->flags[iter >> 4];
    uVar5 = iter * 2 & 0x1e;
    if ((uVar1 >> (sbyte)uVar5 & 3) == 0) {
      pkVar2->flags[iter >> 4] = uVar1 | 1 << uVar5;
      pkVar2->size = pkVar2->size - 1;
    }
  }
  psVar3 = (ref->_lru_link).next;
  psVar4 = (ref->_lru_link).prev;
  psVar3->prev = psVar4;
  psVar4->next = psVar3;
  (ref->_lru_link).next = (st_h2o_linklist_t *)0x0;
  (ref->_lru_link).prev = (st_h2o_linklist_t *)0x0;
  psVar3 = (ref->_age_link).next;
  psVar4 = (ref->_age_link).prev;
  psVar3->prev = psVar4;
  psVar4->next = psVar3;
  (ref->_age_link).next = (st_h2o_linklist_t *)0x0;
  (ref->_age_link).prev = (st_h2o_linklist_t *)0x0;
  cache->size = cache->size - (ref->value).len;
  h2o_cache_release(cache,ref);
  return;
}

Assistant:

static void erase_ref(h2o_cache_t *cache, khiter_t iter, int reuse)
{
    h2o_cache_ref_t *ref = kh_key(cache->table, iter);

    if (!reuse)
        kh_del(cache, cache->table, iter);
    h2o_linklist_unlink(&ref->_lru_link);
    h2o_linklist_unlink(&ref->_age_link);
    cache->size -= ref->value.len;

    h2o_cache_release(cache, ref);
}